

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O1

void SUNDlsMat_denseMatvec(realtype **a,realtype *x,realtype *y,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < m) {
    memset(y,0,(ulong)(uint)m * 8);
  }
  if (0 < n) {
    uVar2 = 0;
    do {
      if (0 < m) {
        prVar1 = a[uVar2];
        uVar3 = 0;
        do {
          y[uVar3] = prVar1[uVar3] * x[uVar2] + y[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)m != uVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)n);
  }
  return;
}

Assistant:

void SUNDlsMat_denseMatvec(realtype **a, realtype *x, realtype *y, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (i=0; i<m; i++) {
    y[i] = 0.0;
  }

  for (j=0; j<n; j++) {
    col_j = a[j];
    for (i=0; i<m; i++)
      y[i] += col_j[i]*x[j];
  }
}